

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

string * cs222::toUpper(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (str->_M_dataplus)._M_p;
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = toupper((int)pcVar1[sVar5]);
      pcVar3[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpper(const std::string& str)
    {
        std::string upper(str);
        std::transform(str.begin(), str.end(), upper.begin(), toupper);
        return upper;
    }